

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::builtins::ArrayUniqueMethod::eval
          (ConstantValue *__return_storage_ptr__,ArrayUniqueMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *callInfo)

{
  long lVar1;
  group_type_pointer pgVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  value_type_pointer pCVar7;
  ConstantValue *pCVar8;
  bool bVar9;
  Expression *this_00;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *pvVar10;
  size_t sVar11;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:253:13),_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
  pCVar12;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:232:13),_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
  pCVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ConstantValue *pCVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> pVar40;
  bool __ret;
  flat_hash_set<ConstantValue> seen;
  locator res;
  ConstantValue cv;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  ConstantValue arr;
  CVIterator<false> it;
  SVQueue result;
  undefined1 local_201 [9];
  undefined1 local_1f8 [24];
  value_type_pointer pCStack_1e0;
  ulong local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [24];
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ConstantValue *local_188;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_180;
  char local_160;
  uchar local_158;
  uchar uStack_157;
  uchar uStack_156;
  uchar uStack_155;
  uchar uStack_154;
  uchar uStack_153;
  uchar uStack_152;
  uchar uStack_151;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  uchar uStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  uchar uStack_149;
  ArrayUniqueMethod *local_148;
  Expression *local_140;
  EvalContext *local_138;
  ConstantValue *local_130;
  ulong local_128;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  local_120;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_108;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
  local_e0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  uint32_t local_68;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_148 = this;
  Expression::eval((ConstantValue *)&local_108,*args->_M_ptr,context);
  if (local_108._M_index == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
  }
  else {
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_b8._16_16_ = (undefined1  [16])0x0;
    local_b8._0_16_ = (undefined1  [16])0x0;
    local_130 = __return_storage_ptr__;
    std::_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::_M_initialize_map
              ((_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_b8,
               0);
    local_68 = 0;
    pVar40 = CallExpression::SystemCallInfo::getIteratorInfo(callInfo);
    this_00 = pVar40.first;
    if (this_00 == (Expression *)0x0) {
      local_1f8._0_8_ = (SVQueue *)0x3f;
      local_1f8._8_8_ = 1;
      stack0xfffffffffffffe18 = ZEXT816(0x516460);
      local_1d8 = 0;
      local_1d0 = 0;
      std::
      visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                (&local_e0,(anon_class_1_0_00000001 *)&local_180,
                 (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  *)&local_108);
      uVar15 = 0;
      while( true ) {
        std::
        visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                    *)&local_180,(anon_class_1_0_00000001 *)local_1c8,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)&local_108);
        local_120.func.this._0_1_ = '\x01';
        local_1c8._0_8_ = &local_120;
        local_1c8._8_8_ = &local_e0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
          ::_S_vtable._M_arr[(long)local_160 + 1]._M_data)
                  ((anon_class_16_2_9763bfdf *)local_1c8,
                   (variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                    *)&local_180);
        if ((char)local_120.func.this == '\x01') break;
        pCVar13 = std::
                  visit<slang::CVIterator<false>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                            ((anon_class_1_0_00000001 *)&local_180,&local_e0.current);
        sVar11 = ConstantValue::hash(pCVar13);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = sVar11;
        local_1a0 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                    SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar16 = local_1a0 >> ((byte)local_1f8[0] & 0x3f);
        lVar1 = (local_1a0 & 0xff) * 4;
        uVar24 = (&UNK_0051605c)[lVar1];
        uVar25 = (&UNK_0051605d)[lVar1];
        uVar26 = (&UNK_0051605e)[lVar1];
        uVar27 = (&UNK_0051605f)[lVar1];
        pCVar18 = (ConstantValue *)(ulong)((uint)local_1a0 & 7);
        uVar17 = 0;
        uVar28 = uVar24;
        uVar29 = uVar25;
        uVar30 = uVar26;
        uVar31 = uVar27;
        uVar32 = uVar24;
        uVar33 = uVar25;
        uVar34 = uVar26;
        uVar35 = uVar27;
        uVar36 = uVar24;
        uVar37 = uVar25;
        uVar38 = uVar26;
        uVar39 = uVar27;
        local_1a8 = uVar16;
        do {
          uVar6 = local_1f8._16_8_;
          pgVar2 = (group_type_pointer)(local_1f8._16_8_ + uVar16 * 0x10);
          auVar23[0] = -(pgVar2->m[0].n == uVar24);
          auVar23[1] = -(pgVar2->m[1].n == uVar25);
          auVar23[2] = -(pgVar2->m[2].n == uVar26);
          auVar23[3] = -(pgVar2->m[3].n == uVar27);
          auVar23[4] = -(pgVar2->m[4].n == uVar28);
          auVar23[5] = -(pgVar2->m[5].n == uVar29);
          auVar23[6] = -(pgVar2->m[6].n == uVar30);
          auVar23[7] = -(pgVar2->m[7].n == uVar31);
          auVar23[8] = -(pgVar2->m[8].n == uVar32);
          auVar23[9] = -(pgVar2->m[9].n == uVar33);
          auVar23[10] = -(pgVar2->m[10].n == uVar34);
          auVar23[0xb] = -(pgVar2->m[0xb].n == uVar35);
          auVar23[0xc] = -(pgVar2->m[0xc].n == uVar36);
          auVar23[0xd] = -(pgVar2->m[0xd].n == uVar37);
          auVar23[0xe] = -(pgVar2->m[0xe].n == uVar38);
          auVar23[0xf] = -(pgVar2->m[0xf].n == uVar39);
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
          uVar20 = uVar17;
          uVar21 = uVar16;
          if (uVar14 != 0) {
            pCVar7 = pCStack_1e0;
            local_1b0 = uVar15;
            local_198 = uVar17;
            local_190 = uVar16;
            local_188 = pCVar18;
            local_158 = uVar24;
            uStack_157 = uVar25;
            uStack_156 = uVar26;
            uStack_155 = uVar27;
            uStack_154 = uVar28;
            uStack_153 = uVar29;
            uStack_152 = uVar30;
            uStack_151 = uVar31;
            uStack_150 = uVar32;
            uStack_14f = uVar33;
            uStack_14e = uVar34;
            uStack_14d = uVar35;
            uStack_14c = uVar36;
            uStack_14b = uVar37;
            uStack_14a = uVar38;
            uStack_149 = uVar39;
            do {
              uVar3 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              bVar9 = slang::operator==(pCVar13,pCVar7 + uVar16 * 0xf + (ulong)uVar3);
              uVar15 = local_1b0;
              pCVar8 = pCVar7 + uVar16 * 0xf + (ulong)uVar3;
              if (bVar9) goto LAB_00461aad;
              uVar14 = uVar14 - 1 & uVar14;
            } while (uVar14 != 0);
            uVar20 = local_198;
            pCVar18 = local_188;
            uVar21 = local_190;
            uVar24 = local_158;
            uVar25 = uStack_157;
            uVar26 = uStack_156;
            uVar27 = uStack_155;
            uVar28 = uStack_154;
            uVar29 = uStack_153;
            uVar30 = uStack_152;
            uVar31 = uStack_151;
            uVar32 = uStack_150;
            uVar33 = uStack_14f;
            uVar34 = uStack_14e;
            uVar35 = uStack_14d;
            uVar36 = uStack_14c;
            uVar37 = uStack_14b;
            uVar38 = uStack_14a;
            uVar39 = uStack_149;
            pCVar8 = (ConstantValue *)local_201._1_8_;
            if (bVar9) goto LAB_00461aad;
          }
          if ((((group_type_pointer)(uVar6 + uVar16 * 0x10))->m[0xf].n &
              *(byte *)((long)&pCVar18[0x208e8].value.
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       + 0x10)) == 0) break;
          uVar17 = uVar20 + 1;
          uVar16 = uVar21 + uVar20 + 1 & local_1f8._8_8_;
        } while (uVar17 <= (ulong)local_1f8._8_8_);
        local_201._1_8_ = (ConstantValue *)0x0;
        pCVar8 = (ConstantValue *)local_201._1_8_;
LAB_00461aad:
        local_201._1_8_ = pCVar8;
        if ((ConstantValue *)local_201._1_8_ == (ConstantValue *)0x0) {
          if (local_1d0 < local_1d8) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
            ::nosize_unchecked_emplace_at<slang::ConstantValue&>
                      ((locator *)&local_180,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                        *)local_1f8,(arrays_type *)local_1f8,local_1a8,local_1a0,pCVar13);
            local_1d0 = local_1d0 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
            ::unchecked_emplace_with_rehash<slang::ConstantValue&>
                      ((locator *)&local_180,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                        *)local_1f8,local_1a0,pCVar13);
          }
          if ((ConstantValue *)local_201._1_8_ == (ConstantValue *)0x0) {
            if ((local_148->isIndexed == true) && (local_108._M_index != '\a')) {
              local_180._0_8_ = uVar15 & 0xffffffff;
              local_180._8_4_ = 0x20;
              local_180._12_2_ = 1;
              SVInt::clearUnusedBits((SVInt *)&local_180);
              std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
              emplace_back<slang::SVInt>
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         local_b8,(SVInt *)&local_180);
              if (((0x40 < (uint)local_180._8_4_) || ((local_180._12_2_ & 0x100) != 0)) &&
                 ((ConstantValue *)local_180._0_8_ != (ConstantValue *)0x0)) {
                operator_delete__((void *)local_180._0_8_);
              }
            }
            else if (local_148->isIndexed == false) {
              pCVar13 = std::
                        visit<slang::CVIterator<false>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                                  ((anon_class_1_0_00000001 *)&local_180,&local_e0.current);
              std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
              emplace_back<slang::ConstantValue>
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         local_b8,pCVar13);
            }
            else {
              pCVar12 = std::
                        visit<slang::CVIterator<false>::key()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                                  ((anon_class_1_0_00000001 *)&local_180,&local_e0.current);
              std::deque<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
              emplace_back<slang::ConstantValue_const&>
                        ((deque<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)
                         local_b8,pCVar12);
            }
          }
        }
        std::
        visit<slang::CVIterator<false>::increment()::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>&>
                  ((anon_class_1_0_00000001 *)&local_180,&local_e0.current);
        uVar15 = (ulong)((int)uVar15 + 1);
      }
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                     *)local_1f8);
    }
    else {
      EvalContext::disableCaching(&local_120,context);
      local_58._M_index = '\0';
      local_188 = EvalContext::createLocal(context,pVar40.second,(ConstantValue *)&local_58);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      local_1f8._0_8_ = (SVQueue *)0x3f;
      local_1f8._8_8_ = 1;
      stack0xfffffffffffffe18 = ZEXT816(0x516460);
      local_1d8 = 0;
      local_1d0 = 0;
      std::
      visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                (&local_e0,(anon_class_1_0_00000001 *)&local_180,
                 (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  *)&local_108);
      uVar15 = 0;
      local_140 = this_00;
      local_138 = context;
      while( true ) {
        std::
        visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                    *)&local_180,(anon_class_1_0_00000001 *)local_1c8,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)&local_108);
        local_201[0] = '\x01';
        local_1c8._0_8_ = local_201;
        local_1c8._8_8_ = &local_e0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
          ::_S_vtable._M_arr[(long)local_160 + 1]._M_data)
                  ((anon_class_16_2_9763bfdf *)local_1c8,
                   (variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                    *)&local_180);
        if (local_201[0] == '\x01') break;
        pvVar10 = &std::
                   visit<slang::CVIterator<false>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                             ((anon_class_1_0_00000001 *)&local_180,&local_e0.current)->value;
        local_180._0_8_ = local_188;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
          ::_S_vtable._M_arr
          [(long)(char)(pvVar10->
                       super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       ).
                       super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       ._M_index + 1]._M_data)
                  ((anon_class_8_1_8991fb9c_conflict *)&local_180,pvVar10);
        Expression::eval((ConstantValue *)&local_180,this_00,context);
        sVar11 = ConstantValue::hash((ConstantValue *)&local_180);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = sVar11;
        local_1a8 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                    SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar20 = local_1a8 >> ((byte)local_1f8[0] & 0x3f);
        lVar1 = (local_1a8 & 0xff) * 4;
        uVar24 = (&UNK_0051605c)[lVar1];
        uVar25 = (&UNK_0051605d)[lVar1];
        uVar26 = (&UNK_0051605e)[lVar1];
        uVar27 = (&UNK_0051605f)[lVar1];
        uVar17 = (ulong)((uint)local_1a8 & 7);
        uVar16 = 0;
        uVar28 = uVar24;
        uVar29 = uVar25;
        uVar30 = uVar26;
        uVar31 = uVar27;
        uVar32 = uVar24;
        uVar33 = uVar25;
        uVar34 = uVar26;
        uVar35 = uVar27;
        uVar36 = uVar24;
        uVar37 = uVar25;
        uVar38 = uVar26;
        uVar39 = uVar27;
        local_1b0 = uVar20;
        local_1a0 = uVar15;
        do {
          uVar6 = local_1f8._16_8_;
          pgVar2 = (group_type_pointer)(local_1f8._16_8_ + uVar20 * 0x10);
          auVar22[0] = -(pgVar2->m[0].n == uVar24);
          auVar22[1] = -(pgVar2->m[1].n == uVar25);
          auVar22[2] = -(pgVar2->m[2].n == uVar26);
          auVar22[3] = -(pgVar2->m[3].n == uVar27);
          auVar22[4] = -(pgVar2->m[4].n == uVar28);
          auVar22[5] = -(pgVar2->m[5].n == uVar29);
          auVar22[6] = -(pgVar2->m[6].n == uVar30);
          auVar22[7] = -(pgVar2->m[7].n == uVar31);
          auVar22[8] = -(pgVar2->m[8].n == uVar32);
          auVar22[9] = -(pgVar2->m[9].n == uVar33);
          auVar22[10] = -(pgVar2->m[10].n == uVar34);
          auVar22[0xb] = -(pgVar2->m[0xb].n == uVar35);
          auVar22[0xc] = -(pgVar2->m[0xc].n == uVar36);
          auVar22[0xd] = -(pgVar2->m[0xd].n == uVar37);
          auVar22[0xe] = -(pgVar2->m[0xe].n == uVar38);
          auVar22[0xf] = -(pgVar2->m[0xf].n == uVar39);
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
          uVar15 = uVar16;
          uVar21 = uVar20;
          if (uVar14 != 0) {
            pCVar7 = pCStack_1e0;
            local_198 = uVar20;
            local_190 = uVar17;
            local_158 = uVar24;
            uStack_157 = uVar25;
            uStack_156 = uVar26;
            uStack_155 = uVar27;
            uStack_154 = uVar28;
            uStack_153 = uVar29;
            uStack_152 = uVar30;
            uStack_151 = uVar31;
            uStack_150 = uVar32;
            uStack_14f = uVar33;
            uStack_14e = uVar34;
            uStack_14d = uVar35;
            uStack_14c = uVar36;
            uStack_14b = uVar37;
            uStack_14a = uVar38;
            uStack_149 = uVar39;
            local_128 = uVar16;
            do {
              uVar3 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              bVar9 = slang::operator==((ConstantValue *)&local_180,
                                        pCVar7 + uVar20 * 0xf + (ulong)uVar3);
              this_00 = local_140;
              context = local_138;
              pCVar18 = pCVar7 + uVar20 * 0xf + (ulong)uVar3;
              if (bVar9) goto LAB_00461724;
              uVar14 = uVar14 - 1 & uVar14;
            } while (uVar14 != 0);
            uVar15 = local_128;
            uVar17 = local_190;
            uVar21 = local_198;
            uVar24 = local_158;
            uVar25 = uStack_157;
            uVar26 = uStack_156;
            uVar27 = uStack_155;
            uVar28 = uStack_154;
            uVar29 = uStack_153;
            uVar30 = uStack_152;
            uVar31 = uStack_151;
            uVar32 = uStack_150;
            uVar33 = uStack_14f;
            uVar34 = uStack_14e;
            uVar35 = uStack_14d;
            uVar36 = uStack_14c;
            uVar37 = uStack_14b;
            uVar38 = uStack_14a;
            uVar39 = uStack_149;
            pCVar18 = (ConstantValue *)local_201._1_8_;
            if (bVar9) goto LAB_00461724;
          }
          if ((((group_type_pointer)(uVar6 + uVar20 * 0x10))->m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[uVar17]) == 0) break;
          uVar16 = uVar15 + 1;
          uVar20 = uVar21 + uVar15 + 1 & local_1f8._8_8_;
        } while (uVar16 <= (ulong)local_1f8._8_8_);
        local_201._1_8_ = (ConstantValue *)0x0;
        pCVar18 = (ConstantValue *)local_201._1_8_;
LAB_00461724:
        local_201._1_8_ = pCVar18;
        uVar15 = local_1a0;
        iVar19 = (int)local_1a0;
        if ((ConstantValue *)local_201._1_8_ == (ConstantValue *)0x0) {
          if (local_1d0 < local_1d8) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
            ::nosize_unchecked_emplace_at<slang::ConstantValue&>
                      ((locator *)local_1c8,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                        *)local_1f8,(arrays_type *)local_1f8,local_1b0,local_1a8,
                       (ConstantValue *)&local_180);
            local_1d0 = local_1d0 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
            ::unchecked_emplace_with_rehash<slang::ConstantValue&>
                      ((locator *)local_1c8,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                        *)local_1f8,local_1a8,(ConstantValue *)&local_180);
          }
          if ((ConstantValue *)local_201._1_8_ == (ConstantValue *)0x0) {
            if ((local_148->isIndexed == true) && (local_108._M_index != '\a')) {
              local_1c8._0_8_ = uVar15 & 0xffffffff;
              local_1c8._8_6_ = 0x100000020;
              SVInt::clearUnusedBits((SVInt *)local_1c8);
              std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
              emplace_back<slang::SVInt>
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         local_b8,(SVInt *)local_1c8);
              if (((0x40 < (uint)local_1c8._8_4_) || ((local_1c8._8_8_ & 0x10000000000) != 0)) &&
                 ((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
                   *)local_1c8._0_8_ !=
                  (ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
                   *)0x0)) {
                operator_delete__((void *)local_1c8._0_8_);
              }
            }
            else if (local_148->isIndexed == false) {
              pCVar13 = std::
                        visit<slang::CVIterator<false>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                                  ((anon_class_1_0_00000001 *)local_1c8,&local_e0.current);
              std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
              emplace_back<slang::ConstantValue>
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         local_b8,pCVar13);
            }
            else {
              pCVar12 = std::
                        visit<slang::CVIterator<false>::key()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                                  ((anon_class_1_0_00000001 *)local_1c8,&local_e0.current);
              std::deque<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
              emplace_back<slang::ConstantValue_const&>
                        ((deque<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)
                         local_b8,pCVar12);
            }
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_180);
        std::
        visit<slang::CVIterator<false>::increment()::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>&>
                  ((anon_class_1_0_00000001 *)&local_180,&local_e0.current);
        uVar15 = (ulong)(iVar19 + 1);
      }
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                     *)local_1f8);
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
      ::~ScopeGuard(&local_120);
    }
    CopyPtr<slang::SVQueue>::CopyPtr<slang::SVQueue>
              ((CopyPtr<slang::SVQueue> *)local_1f8,(SVQueue *)local_b8);
    __return_storage_ptr__ = local_130;
    uVar6 = local_1f8._0_8_;
    local_1f8._0_8_ = (SVQueue *)0x0;
    *(undefined8 *)
     &(local_130->value).
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         = uVar6;
    *(__index_type *)
     ((long)&(local_130->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\b';
    CopyPtr<slang::SVQueue>::~CopyPtr((CopyPtr<slang::SVQueue> *)local_1f8);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_b8);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_108);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        SVQueue result;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        if (iterExpr) {
            SLANG_ASSERT(iterVar);
            auto guard = context.disableCaching();
            auto iterVal = context.createLocal(iterVar);

            uint32_t index = 0;
            flat_hash_set<ConstantValue> seen;
            for (auto it = begin(arr); it != end(arr); ++it, ++index) {
                *iterVal = *it;
                auto cv = iterExpr->eval(context);
                if (seen.emplace(cv).second) {
                    if (isIndexed && !arr.isMap())
                        result.emplace_back(SVInt(32, index, true));
                    else if (isIndexed)
                        result.emplace_back(it.key());
                    else
                        result.emplace_back(std::move(*it));
                }
            }
        }
        else {
            uint32_t index = 0;
            flat_hash_set<ConstantValue> seen;
            for (auto it = begin(arr); it != end(arr); ++it, ++index) {
                if (seen.emplace(*it).second) {
                    if (isIndexed && !arr.isMap())
                        result.emplace_back(SVInt(32, index, true));
                    else if (isIndexed)
                        result.emplace_back(it.key());
                    else
                        result.emplace_back(std::move(*it));
                }
            }
        }

        return result;
    }